

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall FlatSigningProvider::GetKey(FlatSigningProvider *this,CKeyID *keyid,CKey *key)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    bVar1 = LookupHelper<std::map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>,CKeyID,CKey>
                      (&this->keys,keyid,key);
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetKey(const CKeyID& keyid, CKey& key) const { return LookupHelper(keys, keyid, key); }